

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O0

void __thiscall JAMA::Eigenvalue<double>::orthes(Eigenvalue<double> *this)

{
  int iVar1;
  uint uVar2;
  double *pdVar3;
  reference pvVar4;
  int *in_RDI;
  DynamicRectMatrix<double> *this_00;
  double extraout_XMM0_Qa;
  double dVar5;
  int i_8;
  int i_7;
  double g_1;
  int j_4;
  int i_6;
  int m_1;
  int j_3;
  int i_5;
  int j_2;
  int j_1;
  double f_1;
  int i_4;
  int i_3;
  int i_2;
  double f;
  int j;
  double g;
  int i_1;
  double h;
  int i;
  double scale;
  int m;
  int high;
  int low;
  double in_stack_fffffffffffffea8;
  DynamicVector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb0;
  double local_118;
  uint local_98;
  uint local_94;
  double local_90;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  double local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  double local_50;
  uint local_44;
  double local_40;
  uint local_34;
  double local_30;
  uint local_24;
  double local_20;
  uint local_14;
  
  iVar1 = *in_RDI;
  uVar2 = iVar1 - 1;
  for (local_14 = 1; (int)local_14 <= iVar1 + -2; local_14 = local_14 + 1) {
    local_20 = 0.0;
    for (local_24 = local_14; (int)local_24 <= (int)uVar2; local_24 = local_24 + 1) {
      this_00 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
      OpenMD::DynamicRectMatrix<double>::operator()(this_00,local_24,local_14 - 1);
      std::abs((int)this_00);
      local_20 = local_20 + extraout_XMM0_Qa;
    }
    if ((local_20 != 0.0) || (NAN(local_20))) {
      local_30 = 0.0;
      for (local_34 = uVar2; (int)local_14 <= (int)local_34; local_34 = local_34 - 1) {
        pdVar3 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_34,local_14 - 1);
        dVar5 = *pdVar3;
        pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
        *pvVar4 = dVar5 / local_20;
        pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
        dVar5 = *pvVar4;
        pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
        local_30 = dVar5 * *pvVar4 + local_30;
      }
      local_40 = sqrt(local_30);
      pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                         (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
      if (0.0 < *pvVar4) {
        local_40 = -local_40;
      }
      pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                         (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
      local_30 = -*pvVar4 * local_40 + local_30;
      pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                         (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
      dVar5 = *pvVar4;
      pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                         (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
      *pvVar4 = dVar5 - local_40;
      for (local_44 = local_14; (int)local_44 < *in_RDI; local_44 = local_44 + 1) {
        local_50 = 0.0;
        for (local_54 = uVar2; (int)local_14 <= (int)local_54; local_54 = local_54 - 1) {
          pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
          dVar5 = *pvVar4;
          pdVar3 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_54,local_44);
          local_50 = dVar5 * *pdVar3 + local_50;
        }
        for (local_58 = local_14; (int)local_58 <= (int)uVar2; local_58 = local_58 + 1) {
          pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
          dVar5 = *pvVar4;
          pdVar3 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_58,local_44);
          *pdVar3 = -(local_50 / local_30) * dVar5 + *pdVar3;
        }
      }
      for (local_5c = 0; (int)local_5c <= (int)uVar2; local_5c = local_5c + 1) {
        local_68 = 0.0;
        for (local_6c = uVar2; (int)local_14 <= (int)local_6c; local_6c = local_6c - 1) {
          pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
          dVar5 = *pvVar4;
          pdVar3 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_5c,local_6c);
          local_68 = dVar5 * *pdVar3 + local_68;
        }
        for (local_70 = local_14; (int)local_70 <= (int)uVar2; local_70 = local_70 + 1) {
          pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
          dVar5 = *pvVar4;
          pdVar3 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_5c,local_70);
          *pdVar3 = -(local_68 / local_30) * dVar5 + *pdVar3;
        }
      }
      pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                         (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
      dVar5 = *pvVar4;
      pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                         (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
      *pvVar4 = local_20 * dVar5;
      pdVar3 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_14,local_14 - 1);
      *pdVar3 = local_20 * local_40;
    }
  }
  for (local_74 = 0; (int)local_74 < *in_RDI; local_74 = local_74 + 1) {
    for (local_78 = 0; (int)local_78 < *in_RDI; local_78 = local_78 + 1) {
      local_118 = 1.0;
      if (local_74 != local_78) {
        local_118 = 0.0;
      }
      pdVar3 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_74,local_78);
      *pdVar3 = local_118;
    }
  }
  for (local_7c = iVar1 - 2; 0 < (int)local_7c; local_7c = local_7c - 1) {
    pdVar3 = OpenMD::DynamicRectMatrix<double>::operator()
                       ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_7c,local_7c - 1);
    local_80 = local_7c;
    if ((*pdVar3 != 0.0) || (NAN(*pdVar3))) {
      while (local_80 = local_80 + 1, (int)local_80 <= (int)uVar2) {
        pdVar3 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_80,local_7c - 1);
        dVar5 = *pdVar3;
        pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
        *pvVar4 = dVar5;
      }
      for (local_84 = local_7c; (int)local_84 <= (int)uVar2; local_84 = local_84 + 1) {
        local_90 = 0.0;
        for (local_94 = local_7c; (int)local_94 <= (int)uVar2; local_94 = local_94 + 1) {
          pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
          dVar5 = *pvVar4;
          pdVar3 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_94,local_84);
          local_90 = dVar5 * *pdVar3 + local_90;
        }
        pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
        dVar5 = *pvVar4;
        pdVar3 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_7c,local_7c - 1);
        dVar5 = (local_90 / dVar5) / *pdVar3;
        for (local_98 = local_7c; (int)local_98 <= (int)uVar2; local_98 = local_98 + 1) {
          in_stack_fffffffffffffea8 = dVar5;
          pvVar4 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffeb0,(size_type)dVar5);
          in_stack_fffffffffffffeb0 = (DynamicVector<double,_std::allocator<double>_> *)*pvVar4;
          pdVar3 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_98,local_84);
          *pdVar3 = in_stack_fffffffffffffea8 * (double)in_stack_fffffffffffffeb0 + *pdVar3;
        }
      }
    }
  }
  return;
}

Assistant:

void orthes() {
      //  This is derived from the Algol procedures orthes and ortran,
      //  by Martin and Wilkinson, Handbook for Auto. Comp.,
      //  Vol.ii-Linear Algebra, and the corresponding
      //  Fortran subroutines in EISPACK.

      int low  = 0;
      int high = n - 1;

      for (int m = low + 1; m <= high - 1; m++) {
        // Scale column.

        Real scale = 0.0;
        for (int i = m; i <= high; i++) {
          scale = scale + abs(H(i, m - 1));
        }
        if (scale != 0.0) {
          // Compute Householder transformation.

          Real h = 0.0;
          for (int i = high; i >= m; i--) {
            ort(i) = H(i, m - 1) / scale;
            h += ort(i) * ort(i);
          }
          Real g = sqrt(h);
          if (ort(m) > 0) { g = -g; }
          h      = h - ort(m) * g;
          ort(m) = ort(m) - g;

          // Apply Householder similarity transformation
          // H = (I-u*u'/h)*H*(I-u*u')/h)

          for (int j = m; j < n; j++) {
            Real f = 0.0;
            for (int i = high; i >= m; i--) {
              f += ort(i) * H(i, j);
            }
            f = f / h;
            for (int i = m; i <= high; i++) {
              H(i, j) -= f * ort(i);
            }
          }

          for (int i = 0; i <= high; i++) {
            Real f = 0.0;
            for (int j = high; j >= m; j--) {
              f += ort(j) * H(i, j);
            }
            f = f / h;
            for (int j = m; j <= high; j++) {
              H(i, j) -= f * ort(j);
            }
          }
          ort(m)      = scale * ort(m);
          H(m, m - 1) = scale * g;
        }
      }

      // Accumulate transformations (Algol's ortran).

      for (int i = 0; i < n; i++) {
        for (int j = 0; j < n; j++) {
          V(i, j) = (i == j ? 1.0 : 0.0);
        }
      }

      for (int m = high - 1; m >= low + 1; m--) {
        if (H(m, m - 1) != 0.0) {
          for (int i = m + 1; i <= high; i++) {
            ort(i) = H(i, m - 1);
          }
          for (int j = m; j <= high; j++) {
            Real g = 0.0;
            for (int i = m; i <= high; i++) {
              g += ort(i) * V(i, j);
            }
            // Double division avoids possible underflow
            g = (g / ort(m)) / H(m, m - 1);
            for (int i = m; i <= high; i++) {
              V(i, j) += g * ort(i);
            }
          }
        }
      }
    }